

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sws.c
# Opt level: O0

void nn_sws_term(nn_sws *self)

{
  nn_sws *self_local;
  
  if (self->state != 1) {
    fprintf(_stderr,"Assertion failed: %d == %s (%s:%d)\n",(ulong)(uint)self->state,
            "NN_SWS_STATE_IDLE",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/ws/sws.c"
            ,0xa4);
    fflush(_stderr);
    nn_err_abort();
  }
  nn_fsm_event_term(&self->done);
  nn_msg_term(&self->outmsg);
  nn_msg_array_term(&self->inmsg_array);
  nn_pipebase_term(&self->pipebase);
  nn_ws_handshake_term(&self->handshaker);
  nn_fsm_term(&self->fsm);
  return;
}

Assistant:

void nn_sws_term (struct nn_sws *self)
{
    nn_assert_state (self, NN_SWS_STATE_IDLE);

    nn_fsm_event_term (&self->done);
    nn_msg_term (&self->outmsg);
    nn_msg_array_term (&self->inmsg_array);
    nn_pipebase_term (&self->pipebase);
    nn_ws_handshake_term (&self->handshaker);
    nn_fsm_term (&self->fsm);
}